

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

string * __thiscall
spvtools::val::ValidationState_t::Disassemble_abi_cxx11_
          (string *__return_storage_ptr__,ValidationState_t *this,Instruction *inst)

{
  spv_parsed_instruction_t *psVar1;
  spv_parsed_instruction_t *c_inst;
  Instruction *inst_local;
  ValidationState_t *this_local;
  
  psVar1 = Instruction::c_inst(inst);
  Disassemble_abi_cxx11_(__return_storage_ptr__,this,psVar1->words,psVar1->num_words);
  return __return_storage_ptr__;
}

Assistant:

std::string ValidationState_t::Disassemble(const Instruction& inst) const {
  const spv_parsed_instruction_t& c_inst(inst.c_inst());
  return Disassemble(c_inst.words, c_inst.num_words);
}